

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

bool check_valid(char *chesses,int row,int col)

{
  int index;
  int col_local;
  int row_local;
  char *chesses_local;
  
  if ((((row < 1) || (0xf < row)) || (col < 1)) || (0xf < col)) {
    chesses_local._7_1_ = false;
  }
  else if (chesses[(row + -1) * 0xf + col + -1] == '\0') {
    chesses_local._7_1_ = true;
  }
  else {
    chesses_local._7_1_ = false;
  }
  return chesses_local._7_1_;
}

Assistant:

bool check_valid(char chesses[], int row, int col) {
    if (row <= 0 || row > 15 || col <= 0 || col > 15) {
        return false;
    }

    int index = (row - 1) * 15 + (col - 1);
    if (chesses[index] != 0) {
        return false;
    }

    return true;
}